

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::pushConditionalResult(Parser *this,ConditionalResult cond)

{
  reference pvVar1;
  bool local_21;
  bool local_17;
  value_type local_16;
  ConditionalResult local_14;
  ConditionInfo info;
  Parser *pPStack_10;
  ConditionalResult cond_local;
  Parser *this_local;
  
  local_14 = cond;
  pPStack_10 = this;
  pvVar1 = std::vector<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>::back
                     (&this->conditionStack);
  local_17 = ((ushort)*pvVar1 & 1) != 0 && local_14 != False;
  local_21 = ((ushort)*pvVar1 >> 8 & 1) != 0 || local_14 == Unknown;
  local_16.inUnknownBlock = local_21;
  local_16.inTrueBlock = local_17;
  std::vector<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>::push_back
            (&this->conditionStack,&local_16);
  return;
}

Assistant:

void Parser::pushConditionalResult(ConditionalResult cond)
{
	ConditionInfo info = conditionStack.back();
	info.inTrueBlock = info.inTrueBlock && cond != ConditionalResult::False;
	info.inUnknownBlock = info.inUnknownBlock || cond == ConditionalResult::Unknown;
	conditionStack.push_back(info);
}